

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomx.cpp
# Opt level: O2

void randomx_release_cache(randomx_cache *cache)

{
  if (cache->memory != (uint8_t *)0x0) {
    (*cache->dealloc)(cache);
  }
  randomx_cache::~randomx_cache(cache);
  operator_delete(cache);
  return;
}

Assistant:

void randomx_release_cache(randomx_cache* cache) {
		assert(cache != nullptr);
		if (cache->memory != nullptr) {
			cache->dealloc(cache);
		}
		delete cache;
	}